

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.cpp
# Opt level: O0

void SpookyHash::Hash128(void *message,size_t length,uint64 *hash1,uint64 *hash2)

{
  uint64 *s7;
  uint64 *in_RCX;
  uint64 *in_RDX;
  ulong in_RSI;
  uint64 *in_RDI;
  size_t remainder;
  anon_union_8_3_837c87a1 u;
  uint64 *end;
  uint64 buf [12];
  uint64 h11;
  uint64 h10;
  uint64 h9;
  uint64 h8;
  uint64 h7;
  uint64 h6;
  uint64 h5;
  uint64 h4;
  uint64 h3;
  uint64 h2;
  uint64 h1;
  uint64 h0;
  uint64 *h4_00;
  uint64 *in_stack_fffffffffffffed0;
  uint64 *in_stack_fffffffffffffee0;
  uint64 *s8;
  uint64 *s9;
  uint64 *in_stack_fffffffffffffef8;
  uint64 *in_stack_ffffffffffffff00;
  uint64 *in_stack_ffffffffffffff10;
  uint64 *in_stack_ffffffffffffff18;
  uint64 *in_stack_ffffffffffffff20;
  uint64 *in_stack_ffffffffffffff28;
  uint64 *in_stack_ffffffffffffff30;
  uint64 *in_stack_ffffffffffffff38;
  uint64 *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  uint64 local_a0;
  uint64 local_98;
  uint64 local_90 [3];
  uint64 local_78 [3];
  uint64 local_60;
  undefined8 local_58;
  uint64 local_50;
  uint64 local_48;
  uint64 *local_40;
  uint64 *local_38;
  ulong local_30;
  uint64 *local_28;
  
  if (in_RSI < 0xc0) {
    Short((void *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
          in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  else {
    local_90[0] = *in_RDX;
    local_98 = *in_RCX;
    local_a0 = 0xdeadbeefdeadbeef;
    local_90[1] = 0xdeadbeefdeadbeef;
    local_78[1] = 0xdeadbeefdeadbeef;
    local_58 = 0xdeadbeefdeadbeef;
    s9 = in_RDI + (in_RSI / 0x60) * 0xc;
    local_90[2] = local_98;
    local_78[0] = local_90[0];
    local_78[2] = local_98;
    local_60 = local_90[0];
    local_50 = local_98;
    local_48 = local_90[0];
    local_40 = in_RCX;
    local_38 = in_RDX;
    local_30 = in_RSI;
    local_28 = in_RDI;
    for (s8 = in_RDI; s8 < s9; s8 = s8 + 0xc) {
      Mix(&local_98,local_90,local_90 + 1,local_90 + 2,local_78,local_78 + 1,
          in_stack_fffffffffffffed0,in_RDI,in_stack_fffffffffffffee0,s8,s9,in_stack_fffffffffffffef8
          ,in_stack_ffffffffffffff00);
    }
    s7 = (uint64 *)(local_30 - ((long)s9 - (long)local_28));
    memcpy(&stack0xfffffffffffffef8,s9,(size_t)s7);
    memset(&stack0xfffffffffffffef8 + (long)s7,0,0x60 - (long)s7);
    h4_00 = &local_a0;
    Mix(&local_98,local_90,local_90 + 1,local_90 + 2,local_78,local_78 + 1,in_stack_fffffffffffffed0
        ,in_RDI,s7,s8,s9,in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
    End(s8,s7,in_RDI,in_stack_fffffffffffffed0,h4_00,&local_a0,in_stack_ffffffffffffff10,
        in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
        in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
    *local_38 = local_48;
    *local_40 = local_50;
  }
  return;
}

Assistant:

void SpookyHash::Hash128(
    const void *message, 
    size_t length, 
    uint64 *hash1, 
    uint64 *hash2)
{
    if (length < sc_bufSize)
    {
        Short(message, length, hash1, hash2);
        return;
    }

    uint64 h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11;
    uint64 buf[sc_numVars];
    uint64 *end;
    union 
    { 
        const uint8 *p8; 
        uint64 *p64; 
        size_t i; 
    } u;
    size_t remainder;
    
    h0=h3=h6=h9  = *hash1;
    h1=h4=h7=h10 = *hash2;
    h2=h5=h8=h11 = sc_const;
    
    u.p8 = (const uint8 *)message;
    end = u.p64 + (length/sc_blockSize)*sc_numVars;

    // handle all whole sc_blockSize blocks of bytes
    if (ALLOW_UNALIGNED_READS || ((u.i & 0x7) == 0))
    {
        while (u.p64 < end)
        { 
            Mix(u.p64, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
	    u.p64 += sc_numVars;
        }
    }
    else
    {
        while (u.p64 < end)
        {
            memcpy(buf, u.p64, sc_blockSize);
            Mix(buf, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
	    u.p64 += sc_numVars;
        }
    }

    // handle the last partial block of sc_blockSize bytes
    remainder = (length - ((const uint8 *)end-(const uint8 *)message));
    memcpy(buf, end, remainder);
    memset(((uint8 *)buf)+remainder, 0, sc_blockSize-remainder);
    ((uint8 *)buf)[sc_blockSize-1] = remainder;
    Mix(buf, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
    
    // do some final mixing 
    End(h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
    *hash1 = h0;
    *hash2 = h1;
}